

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBox.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChBox::ArchiveIN(ChBox *this,ChArchiveIn *marchive)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChVector<double> Lengths;
  undefined **local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  double local_38;
  char *local_30;
  undefined1 *local_28;
  undefined1 local_20;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChBox>(marchive);
  ChVolume::ArchiveIN(&this->super_ChVolume,marchive);
  local_50 = &local_48;
  local_30 = "Lengths";
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0.0;
  local_20 = 0;
  local_58 = &PTR__ChFunctorArchiveIn_00b03258;
  local_28 = (undefined1 *)&local_58;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  auVar1._8_8_ = uStack_40;
  auVar1._0_8_ = local_48;
  auVar2._8_8_ = 0x3fe0000000000000;
  auVar2._0_8_ = 0x3fe0000000000000;
  auVar2 = vmulpd_avx512vl(auVar1,auVar2);
  *(undefined1 (*) [16])(this->Size).m_data = auVar2;
  (this->Size).m_data[2] = local_38 * 0.5;
  return;
}

Assistant:

void ChBox::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChBox>();
    // deserialize parent class
    ChVolume::ArchiveIN(marchive);
    // stream in all member data:
    ChVector<> Lengths;
    marchive >> CHNVP(Lengths);  // avoid storing 'Size', i.e. half lengths, because less intuitive
    SetLengths(Lengths);
}